

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O2

void __thiscall wasm::SCCs<IntIt,_GraphSCCs>::SCC::Iterator::setVal(Iterator *this)

{
  SCCs<IntIt,_GraphSCCs> *pSVar1;
  
  pSVar1 = this->parent;
  if ((pSVar1 == (SCCs<IntIt,_GraphSCCs> *)0x0) ||
     ((pSVar1->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == false)) {
    if ((this->val).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      (this->val).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged = false;
    }
  }
  else {
    (this->val).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> =
         (_Optional_payload_base<unsigned_int>)
         ((ulong)(pSVar1->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1] | 0x100000000);
  }
  return;
}

Assistant:

void setVal() {
        if (isEnd()) {
          val = std::nullopt;
        } else {
          val = parent->stack.back();
        }
      }